

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::ComparisonFunction::ComparisonFunction
          (ComparisonFunction *this,string *funcName,FunctionParameters funcParameters,
          string *funcImplementation)

{
  string *funcImplementation_local;
  FunctionParameters funcParameters_local;
  string *funcName_local;
  ComparisonFunction *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)funcName);
  this->parameters = funcParameters;
  std::__cxx11::string::string((string *)&this->implementation,(string *)funcImplementation);
  return;
}

Assistant:

ComparisonFunction		(const std::string& funcName, const FunctionParameters funcParameters, const std::string& funcImplementation)
		: name				(funcName)
		, parameters		(funcParameters)
		, implementation	(funcImplementation) {}